

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::RegexCompile::scanPosixProp(RegexCompile *this)

{
  RegexPatternChar *c;
  UBool UVar1;
  UBool UVar2;
  UBool UVar3;
  int64_t iVar4;
  UText *pUVar5;
  RegexPatternChar RVar6;
  int64_t iVar7;
  int64_t iVar8;
  UChar32 UVar9;
  UChar32 UVar10;
  int64_t index;
  UnicodeSet *pUVar11;
  long lVar12;
  int srcChar;
  bool negated;
  UnicodeString propName;
  UnicodeString local_70;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = this->fScanIndex;
    pUVar5 = this->fRXPat->fPattern;
    if (pUVar5->nativeIndexingLimit < pUVar5->chunkOffset) {
      index = (*pUVar5->pFuncs->mapOffsetToNative)(pUVar5);
    }
    else {
      index = (long)pUVar5->chunkOffset + pUVar5->chunkNativeStart;
    }
    UVar1 = this->fQuoteMode;
    UVar2 = this->fInBackslashQuote;
    UVar3 = this->fEOLComments;
    iVar7 = this->fLineNum;
    iVar8 = this->fCharNum;
    UVar9 = this->fLastChar;
    UVar10 = this->fPeekChar;
    c = &this->fC;
    RVar6 = this->fC;
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0024c170;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    nextChar(this,c);
    srcChar = c->fChar;
    negated = srcChar == 0x5e;
    if (negated) {
      nextChar(this,c);
      srcChar = c->fChar;
    }
    do {
      UnicodeString::append(&local_70,srcChar);
      nextChar(this,c);
      if (((this->fC).fQuoted != '\0') || (srcChar = c->fChar, srcChar == -1)) goto LAB_0016da3d;
    } while (srcChar != 0x3a);
    nextChar(this,c);
    if (c->fChar == 0x5d) {
      pUVar11 = createSetForProperty(this,&local_70,negated);
    }
    else {
LAB_0016da3d:
      this->fScanIndex = iVar4;
      this->fQuoteMode = UVar1;
      this->fInBackslashQuote = UVar2;
      this->fEOLComments = UVar3;
      this->fLineNum = iVar7;
      this->fCharNum = iVar8;
      this->fLastChar = UVar9;
      this->fPeekChar = UVar10;
      this->fC = RVar6;
      pUVar5 = this->fRXPat->fPattern;
      lVar12 = index - pUVar5->chunkNativeStart;
      if (((lVar12 < 0) || (pUVar5->nativeIndexingLimit <= lVar12)) ||
         (0xdbff < (ushort)pUVar5->chunkContents[lVar12])) {
        utext_setNativeIndex_63(pUVar5,index);
      }
      else {
        pUVar5->chunkOffset = (int32_t)lVar12;
      }
      pUVar11 = (UnicodeSet *)0x0;
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  else {
    pUVar11 = (UnicodeSet *)0x0;
  }
  return pUVar11;
}

Assistant:

UnicodeSet *RegexCompile::scanPosixProp() {
    UnicodeSet    *uset = NULL;

    if (U_FAILURE(*fStatus)) {
        return NULL;
    }

    U_ASSERT(fC.fChar == chColon);

    // Save the scanner state.
    // TODO:  move this into the scanner, with the state encapsulated in some way.  Ticket 6062
    int64_t     savedScanIndex        = fScanIndex;
    int64_t     savedNextIndex        = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
    UBool       savedQuoteMode        = fQuoteMode;
    UBool       savedInBackslashQuote = fInBackslashQuote;
    UBool       savedEOLComments      = fEOLComments;
    int64_t     savedLineNum          = fLineNum;
    int64_t     savedCharNum          = fCharNum;
    UChar32     savedLastChar         = fLastChar;
    UChar32     savedPeekChar         = fPeekChar;
    RegexPatternChar savedfC          = fC;

    // Scan for a closing ].   A little tricky because there are some perverse
    //   edge cases possible.  "[:abc\Qdef:] \E]"  is a valid non-property expression,
    //   ending on the second closing ].

    UnicodeString propName;
    UBool         negated  = FALSE;

    // Check for and consume the '^' in a negated POSIX property, e.g.  [:^Letter:]
    nextChar(fC);
    if (fC.fChar == chUp) {
       negated = TRUE;
       nextChar(fC);
    }

    // Scan for the closing ":]", collecting the property name along the way.
    UBool  sawPropSetTerminator = FALSE;
    for (;;) {
        propName.append(fC.fChar);
        nextChar(fC);
        if (fC.fQuoted || fC.fChar == -1) {
            // Escaped characters or end of input - either says this isn't a [:Property:]
            break;
        }
        if (fC.fChar == chColon) {
            nextChar(fC);
            if (fC.fChar == chRBracket) {
                sawPropSetTerminator = TRUE;
            }
            break;
        }
    }

    if (sawPropSetTerminator) {
        uset = createSetForProperty(propName, negated);
    }
    else
    {
        // No closing ":]".
        //  Restore the original scan position.
        //  The main scanner will retry the input as a normal set expression,
        //    not a [:Property:] expression.
        fScanIndex        = savedScanIndex;
        fQuoteMode        = savedQuoteMode;
        fInBackslashQuote = savedInBackslashQuote;
        fEOLComments      = savedEOLComments;
        fLineNum          = savedLineNum;
        fCharNum          = savedCharNum;
        fLastChar         = savedLastChar;
        fPeekChar         = savedPeekChar;
        fC                = savedfC;
        UTEXT_SETNATIVEINDEX(fRXPat->fPattern, savedNextIndex);
    }
    return uset;
}